

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

Status * __thiscall
draco::ObjDecoder::DecodeInternal(Status *__return_storage_ptr__,ObjDecoder *this)

{
  int *piVar1;
  uint uVar2;
  PointCloud *this_00;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var3;
  size_t sVar4;
  ulong uVar5;
  DataType DVar6;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> this_01;
  bool bVar7;
  int c;
  ValueType VVar8;
  int iVar9;
  int iVar10;
  __uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
  _Var11;
  FaceIndex i_2;
  FaceIndex face_id;
  long lVar12;
  __node_base *p_Var13;
  __node_base *p_Var14;
  AttributeValueIndex avi;
  allocator<char> local_102;
  allocator<char> local_101;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> metadata;
  AttributeValueIndex i_1;
  undefined4 uStack_f4;
  Mesh **local_d8;
  GeometryAttribute va;
  uint8_t i;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_70;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_68;
  unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_> local_60;
  Status status;
  
  this->counting_mode_ = true;
  this->last_material_id_ = 0;
  this->last_sub_obj_id_ = 0;
  piVar1 = &this->num_obj_faces_;
  this->num_obj_faces_ = 0;
  this->num_positions_ = 0;
  this->num_tex_coords_ = 0;
  this->num_normals_ = 0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->material_name_to_id_)._M_h);
  this->last_sub_obj_id_ = 0;
  status.code_ = OK;
  status.error_msg_._M_dataplus._M_p = (pointer)&status.error_msg_.field_2;
  status.error_msg_._M_string_length = 0;
  status.error_msg_.field_2._M_local_buf[0] = '\0';
  while (bVar7 = ParseDefinition(this,&status), bVar7) {
    if (status.code_ != OK) goto LAB_0010c20e;
  }
  if (status.code_ != OK) goto LAB_0010c20e;
  if ((this->mesh_files_ !=
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0) && ((this->input_file_name_)._M_string_length != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this->mesh_files_,&this->input_file_name_);
  }
  iVar10 = *piVar1;
  if ((long)iVar10 == 0) {
    iVar9 = this->num_positions_;
    if (iVar9 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&va,"No position attribute",(allocator<char> *)&i_1);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
    }
    else if (this->num_tex_coords_ == iVar9 || this->num_tex_coords_ < 1) {
      if (this->num_normals_ == iVar9 || this->num_normals_ < 1) {
        this->out_mesh_ = (Mesh *)0x0;
        goto LAB_0010c2ef;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&va,"Invalid number of normals for a point cloud",(allocator<char> *)&i_1
                );
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&va,"Invalid number of texture coordinates for a point cloud",
                 (allocator<char> *)&i_1);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&va);
    }
    std::__cxx11::string::~string((string *)&va);
    goto LAB_0010c21e;
  }
  iVar9 = iVar10;
  if (this->out_mesh_ != (Mesh *)0x0) {
    Mesh::SetNumFaces(this->out_mesh_,(long)iVar10);
    iVar9 = *piVar1;
  }
  if (iVar9 < 1) {
LAB_0010c2ef:
    VVar8 = this->num_positions_;
    this->out_point_cloud_->num_points_ = VVar8;
  }
  else {
    this->out_point_cloud_->num_points_ = iVar9 * 3;
    VVar8 = this->num_positions_;
  }
  local_d8 = &this->out_mesh_;
  if (0 < (int)VVar8) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,POSITION,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
    iVar9 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar10 == 0,this->num_positions_);
    this->pos_att_id_ = iVar9;
  }
  if (0 < this->num_tex_coords_) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,TEX_COORD,(DataBuffer *)0x0,'\x02',DT_FLOAT32,false,8,0);
    iVar9 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar10 == 0,this->num_tex_coords_);
    this->tex_att_id_ = iVar9;
  }
  if (0 < this->num_normals_) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,NORMAL,(DataBuffer *)0x0,'\x03',DT_FLOAT32,false,0xc,0);
    iVar10 = PointCloud::AddAttribute(this->out_point_cloud_,&va,iVar10 == 0,this->num_normals_);
    this->norm_att_id_ = iVar10;
  }
  if ((this->preserve_polygons_ == true) && (this->has_polygons_ == true)) {
    GeometryAttribute::GeometryAttribute(&va);
    GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DT_UINT8,false,1,0);
    this_00 = this->out_point_cloud_;
    iVar10 = PointCloud::AddAttribute(this_00,&va,false,2);
    this->added_edge_att_id_ = iVar10;
    _i_1 = (pointer)0x100000000;
    for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 4) {
      uVar2 = *(uint *)((long)&i_1.value_ + lVar12);
      i = (uint8_t)uVar2;
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this_00->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[this->added_edge_att_id_]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar4 = *(size_t *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(sVar4 * (uVar2 & 0xff) +
                     **(long **)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&i,sVar4);
    }
    _Var11.
    super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
    .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>)
         operator_new(0x68);
    AttributeMetadata::AttributeMetadata
              ((AttributeMetadata *)
               _Var11.
               super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
               .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
    metadata._M_t.
    super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
    .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
          )(__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )_Var11.
             super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
             .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"name",&local_101);
    std::__cxx11::string::string<std::allocator<char>>((string *)&i,"added_edges",&local_102);
    Metadata::AddEntryString
              ((Metadata *)
               _Var11.
               super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
               .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,(string *)&i_1
               ,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::__cxx11::string::~string((string *)&i_1);
    local_60 = (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               )(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 )metadata._M_t.
                  super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
    metadata._M_t.
    super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>.
    _M_t.
    super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
    .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
         (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
          )(__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
            )0x0;
    PointCloud::AddAttributeMetadata(this_00,this->added_edge_att_id_,&local_60);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    ~unique_ptr(&local_60);
    std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
    ~unique_ptr(&metadata);
  }
  iVar10 = this->num_obj_faces_;
  if (0 < iVar10 && 0 < this->num_materials_) {
    GeometryAttribute::GeometryAttribute(&va);
    bVar7 = 0xffff < (uint)this->num_materials_;
    lVar12 = (ulong)((uint)bVar7 * 2) + 2;
    DVar6 = bVar7 + 4 + (uint)bVar7;
    if (this->num_materials_ < 0x100) {
      lVar12 = 1;
      DVar6 = DT_UINT8;
    }
    GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DVar6,false,lVar12,0);
    iVar10 = PointCloud::AddAttribute(this->out_point_cloud_,&va,false,this->num_materials_);
    this->material_att_id_ = iVar10;
    lVar12 = 0;
    while( true ) {
      i_1.value_ = (int)lVar12;
      if (this->num_materials_ <= lVar12) break;
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->out_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[this->material_att_id_]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar4 = *(size_t *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(sVar4 * lVar12 +
                     **(long **)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&i_1,sVar4);
      lVar12 = lVar12 + 1;
    }
    if (this->use_metadata_ != false) {
      _Var11.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
            )operator_new(0x68);
      AttributeMetadata::AttributeMetadata
                ((AttributeMetadata *)
                 _Var11.
                 super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
      metadata._M_t.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )(__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
              )_Var11.
               super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
               .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"name",&local_101);
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,"material",&local_102);
      Metadata::AddEntryString
                ((Metadata *)
                 _Var11.
                 super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
                 (string *)&i_1,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&i_1);
      p_Var14 = &(this->material_name_to_id_)._M_h._M_before_begin;
      while (this_01._M_t.
             super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
             .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
                  metadata._M_t.
                  super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                  .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
            p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        Metadata::AddEntryInt
                  ((Metadata *)
                   metadata._M_t.
                   super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                   .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
                   (string *)(p_Var14 + 1),*(int32_t *)&p_Var14[5]._M_nxt);
      }
      if ((this->material_file_name_)._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i_1,"file_name",(allocator<char> *)&i);
        Metadata::AddEntryString
                  ((Metadata *)
                   this_01._M_t.
                   super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                   .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
                   (string *)&i_1,&this->material_file_name_);
        std::__cxx11::string::~string((string *)&i_1);
      }
      local_68 = (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  )(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    )metadata._M_t.
                     super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                     .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      metadata._M_t.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )(__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
              )0x0;
      PointCloud::AddAttributeMetadata(this->out_point_cloud_,this->material_att_id_,&local_68);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr(&local_68);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr(&metadata);
    }
    iVar10 = *piVar1;
  }
  if (((this->obj_name_to_id_)._M_h._M_element_count != 0) && (0 < iVar10)) {
    GeometryAttribute::GeometryAttribute(&va);
    uVar5 = (this->obj_name_to_id_)._M_h._M_element_count;
    bVar7 = 0xffff < uVar5;
    lVar12 = (ulong)((uint)bVar7 * 2) + 2;
    DVar6 = bVar7 + 4 + (uint)bVar7;
    if (uVar5 < 0x100) {
      lVar12 = 1;
      DVar6 = DT_UINT8;
    }
    GeometryAttribute::Init(&va,GENERIC,(DataBuffer *)0x0,'\x01',DVar6,false,lVar12,0);
    iVar10 = PointCloud::AddAttribute
                       (this->out_point_cloud_,&va,false,
                        (ValueType)(this->obj_name_to_id_)._M_h._M_element_count);
    this->sub_obj_att_id_ = iVar10;
    p_Var14 = &(this->obj_name_to_id_)._M_h._M_before_begin;
    p_Var13 = p_Var14;
    while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
      i_1.value_ = *(uint *)&p_Var13[5]._M_nxt;
      _Var3._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->out_point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[this->sub_obj_att_id_]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      sVar4 = *(size_t *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl + 0x28);
      memcpy((void *)(*(uint *)&p_Var13[5]._M_nxt * sVar4 +
                     **(long **)_Var3._M_t.
                                super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl)
             ,&i_1,sVar4);
    }
    if (this->use_metadata_ != false) {
      _Var11.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
            )operator_new(0x68);
      AttributeMetadata::AttributeMetadata
                ((AttributeMetadata *)
                 _Var11.
                 super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl);
      metadata._M_t.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )(__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
              )_Var11.
               super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
               .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      std::__cxx11::string::string<std::allocator<char>>((string *)&i_1,"name",&local_101);
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,"sub_obj",&local_102);
      Metadata::AddEntryString
                ((Metadata *)
                 _Var11.
                 super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                 .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
                 (string *)&i_1,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&i_1);
      while (p_Var14 = p_Var14->_M_nxt, p_Var14 != (__node_base *)0x0) {
        Metadata::AddEntryInt
                  ((Metadata *)
                   metadata._M_t.
                   super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                   .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl,
                   (string *)(p_Var14 + 1),*(int32_t *)&p_Var14[5]._M_nxt);
      }
      local_70 = (unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                  )(unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                    )metadata._M_t.
                     super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
                     .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl;
      metadata._M_t.
      super___uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeMetadata_*,_std::default_delete<draco::AttributeMetadata>_>
      .super__Head_base<0UL,_draco::AttributeMetadata_*,_false>._M_head_impl =
           (__uniq_ptr_data<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>,_true,_true>
            )(__uniq_ptr_impl<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>
              )0x0;
      PointCloud::AddAttributeMetadata(this->out_point_cloud_,this->sub_obj_att_id_,&local_70);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr(&local_70);
      std::unique_ptr<draco::AttributeMetadata,_std::default_delete<draco::AttributeMetadata>_>::
      ~unique_ptr(&metadata);
    }
  }
  this->counting_mode_ = false;
  this->last_material_id_ = 0;
  this->last_sub_obj_id_ = 0;
  this->num_obj_faces_ = 0;
  this->num_positions_ = 0;
  this->num_tex_coords_ = 0;
  this->num_normals_ = 0;
  (this->buffer_).pos_ = 0;
  do {
    bVar7 = ParseDefinition(this,&status);
    if (!bVar7) {
      if (status.code_ == OK) {
        if (*local_d8 != (Mesh *)0x0) {
          va.buffer_descriptor_.buffer_id._0_4_ = 0;
          va.buffer_ = (DataBuffer *)0x0;
          iVar10 = 0;
          for (face_id.value_ = 0; face_id.value_ < (uint)*piVar1;
              face_id.value_ = face_id.value_ + 1) {
            for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
              *(int *)((long)&va.buffer_ + lVar12 * 4) = (int)lVar12 + iVar10;
            }
            Mesh::SetFace(*local_d8,face_id,(Face *)&va);
            iVar10 = iVar10 + 3;
          }
        }
        if (this->deduplicate_input_values_ == true) {
          (*this->out_point_cloud_->_vptr_PointCloud[4])();
        }
        (*this->out_point_cloud_->_vptr_PointCloud[5])();
      }
      break;
    }
  } while (status.code_ == OK);
LAB_0010c20e:
  Status::Status(__return_storage_ptr__,&status);
LAB_0010c21e:
  std::__cxx11::string::~string((string *)&status.error_msg_);
  return __return_storage_ptr__;
}

Assistant:

Status ObjDecoder::DecodeInternal() {
  // In the first pass, count the number of different elements in the geometry.
  // In case the desired output is just a point cloud (i.e., when
  // out_mesh_ == nullptr) the decoder will ignore all information about the
  // connectivity that may be included in the source data.
  counting_mode_ = true;
  ResetCounters();
  material_name_to_id_.clear();
  last_sub_obj_id_ = 0;
  // Parse all lines.
  Status status(Status::OK);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }

  if (mesh_files_ && !input_file_name_.empty()) {
    mesh_files_->push_back(input_file_name_);
  }

  bool use_identity_mapping = false;
  if (num_obj_faces_ == 0) {
    // Mesh has no faces. In this case we try to read the geometry as a point
    // cloud where every attribute entry is a point.

    // Ensure the number of all entries is same for all attributes.
    if (num_positions_ == 0) {
      return Status(Status::DRACO_ERROR, "No position attribute");
    }
    if (num_tex_coords_ > 0 && num_tex_coords_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of texture coordinates for a point cloud");
    }
    if (num_normals_ > 0 && num_normals_ != num_positions_) {
      return Status(Status::DRACO_ERROR,
                    "Invalid number of normals for a point cloud");
    }

    out_mesh_ = nullptr;  // Treat the output geometry as a point cloud.
    use_identity_mapping = true;
  }

  // Initialize point cloud and mesh properties.
  if (out_mesh_) {
    // Start decoding a mesh with the given number of faces. For point clouds we
    // silently ignore all data about the mesh connectivity.
    out_mesh_->SetNumFaces(num_obj_faces_);
  }
  if (num_obj_faces_ > 0) {
    out_point_cloud_->set_num_points(3 * num_obj_faces_);
  } else {
    out_point_cloud_->set_num_points(num_positions_);
  }

  // Add attributes if they are present in the input data.
  if (num_positions_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::POSITION, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    pos_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_positions_);
  }
  if (num_tex_coords_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::TEX_COORD, nullptr, 2, DT_FLOAT32, false,
            sizeof(float) * 2, 0);
    tex_att_id_ = out_point_cloud_->AddAttribute(va, use_identity_mapping,
                                                 num_tex_coords_);
  }
  if (num_normals_ > 0) {
    GeometryAttribute va;
    va.Init(GeometryAttribute::NORMAL, nullptr, 3, DT_FLOAT32, false,
            sizeof(float) * 3, 0);
    norm_att_id_ =
        out_point_cloud_->AddAttribute(va, use_identity_mapping, num_normals_);
  }
  if (preserve_polygons_ && has_polygons_) {
    // Create attribute for polygon reconstruction.
    GeometryAttribute va;
    va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    PointCloud *const pc = out_point_cloud_;
    added_edge_att_id_ = pc->AddAttribute(va, false, 2);

    // Set attribute values to zero and one representing old edge and new edge.
    for (const uint8_t i : {0, 1}) {
      const AttributeValueIndex avi(i);
      pc->attribute(added_edge_att_id_)->SetAttributeValue(avi, &i);
    }

    // Add attribute metadata with name.
    std::unique_ptr<AttributeMetadata> metadata(new draco::AttributeMetadata());
    metadata->AddEntryString("name", "added_edges");
    pc->AddAttributeMetadata(added_edge_att_id_, std::move(metadata));
  }
  if (num_materials_ > 0 && num_obj_faces_ > 0) {
    GeometryAttribute va;
    const auto geometry_attribute_type = GeometryAttribute::GENERIC;
    if (num_materials_ < 256) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (num_materials_ < (1 << 16)) {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(geometry_attribute_type, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    material_att_id_ =
        out_point_cloud_->AddAttribute(va, false, num_materials_);

    // Fill the material entries.
    for (int i = 0; i < num_materials_; ++i) {
      const AttributeValueIndex avi(i);
      out_point_cloud_->attribute(material_att_id_)->SetAttributeValue(avi, &i);
    }

    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> material_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      material_metadata->AddEntryString("name", "material");
      // Add all material names.
      for (const auto &itr : material_name_to_id_) {
        material_metadata->AddEntryInt(itr.first, itr.second);
      }
      if (!material_file_name_.empty()) {
        material_metadata->AddEntryString("file_name", material_file_name_);
      }

      out_point_cloud_->AddAttributeMetadata(material_att_id_,
                                             std::move(material_metadata));
    }
  }
  if (!obj_name_to_id_.empty() && num_obj_faces_ > 0) {
    GeometryAttribute va;
    if (obj_name_to_id_.size() < 256) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT8, false, 1, 0);
    } else if (obj_name_to_id_.size() < (1 << 16)) {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT16, false, 2, 0);
    } else {
      va.Init(GeometryAttribute::GENERIC, nullptr, 1, DT_UINT32, false, 4, 0);
    }
    sub_obj_att_id_ = out_point_cloud_->AddAttribute(
        va, false, static_cast<uint32_t>(obj_name_to_id_.size()));
    // Fill the sub object id entries.
    for (const auto &itr : obj_name_to_id_) {
      const AttributeValueIndex i(itr.second);
      out_point_cloud_->attribute(sub_obj_att_id_)->SetAttributeValue(i, &i);
    }
    if (use_metadata_) {
      // Use metadata to store the name of materials.
      std::unique_ptr<AttributeMetadata> sub_obj_metadata =
          std::unique_ptr<AttributeMetadata>(new AttributeMetadata());
      sub_obj_metadata->AddEntryString("name", "sub_obj");
      // Add all sub object names.
      for (const auto &itr : obj_name_to_id_) {
        const AttributeValueIndex i(itr.second);
        sub_obj_metadata->AddEntryInt(itr.first, itr.second);
      }
      out_point_cloud_->AddAttributeMetadata(sub_obj_att_id_,
                                             std::move(sub_obj_metadata));
    }
  }

  // Perform a second iteration of parsing and fill all the data.
  counting_mode_ = false;
  ResetCounters();
  // Start parsing from the beginning of the buffer again.
  buffer()->StartDecodingFrom(0);
  while (ParseDefinition(&status) && status.ok()) {
  }
  if (!status.ok()) {
    return status;
  }
  if (out_mesh_) {
    // Add faces with identity mapping between vertex and corner indices.
    // Duplicate vertices will get removed later.
    Mesh::Face face;
    for (FaceIndex i(0); i < num_obj_faces_; ++i) {
      for (int c = 0; c < 3; ++c) {
        face[c] = 3 * i.value() + c;
      }
      out_mesh_->SetFace(i, face);
    }
  }

#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
  if (deduplicate_input_values_) {
    out_point_cloud_->DeduplicateAttributeValues();
  }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
  out_point_cloud_->DeduplicatePointIds();
#endif
  return status;
}